

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O1

void shift_buffer(ptls_buffer_t *buf,size_t delta)

{
  size_t __n;
  
  if (delta != 0) {
    __n = buf->off - delta;
    if (buf->off < delta) {
      __assert_fail("delta <= buf->off",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/cli.c"
                    ,0x3e,"void shift_buffer(ptls_buffer_t *, size_t)");
    }
    if (__n != 0) {
      memmove(buf->base,buf->base + delta,__n);
    }
    buf->off = buf->off - delta;
  }
  return;
}

Assistant:

static void shift_buffer(ptls_buffer_t *buf, size_t delta)
{
    if (delta != 0) {
        assert(delta <= buf->off);
        if (delta != buf->off)
            memmove(buf->base, buf->base + delta, buf->off - delta);
        buf->off -= delta;
    }
}